

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsymtab.c
# Opt level: O1

void symhash_add(D_SymHash *sh,D_Sym *s)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  uint uVar3;
  D_Sym **ppDVar4;
  D_Sym *pDVar5;
  D_Sym **__s;
  ulong uVar6;
  ulong uVar7;
  anon_struct_40_4_d8687ec6 tv;
  uint local_60 [2];
  ulong *local_58;
  ulong local_50 [4];
  
  uVar1 = (sh->syms).n;
  uVar7 = (ulong)s->hash % (ulong)uVar1;
  ppDVar4 = (sh->syms).v;
  iVar2 = sh->index;
  sh->index = iVar2 + 1;
  s->next = ppDVar4[uVar7];
  ppDVar4[uVar7] = s;
  uVar3 = sh->grow;
  local_50[3] = (ulong)uVar3;
  if ((int)uVar3 <= iVar2) {
    ppDVar4 = (sh->syms).v;
    (sh->syms).n = uVar3;
    sh->grow = uVar3 * 2 + 1;
    __size = local_50[3] * 8;
    __s = (D_Sym **)malloc(__size);
    (sh->syms).v = __s;
    uVar7 = 0;
    memset(__s,0,__size);
    local_60[0] = 0;
    local_58 = (ulong *)0x0;
LAB_0012cb74:
    do {
      pDVar5 = ppDVar4[uVar7];
      if (pDVar5 != (D_Sym *)0x0) {
        ppDVar4[uVar7] = pDVar5->next;
        if (local_58 == (ulong *)0x0) {
          uVar6 = (ulong)local_60[0];
          local_60[0] = local_60[0] + 1;
          local_50[uVar6] = (ulong)pDVar5;
          local_58 = local_50;
        }
        else {
          uVar6 = (ulong)local_60[0];
          if (local_58 == local_50) {
            if (2 < local_60[0]) goto LAB_0012cbcc;
          }
          else if ((local_60[0] & 7) == 0) {
LAB_0012cbcc:
            vec_add_internal(local_60,pDVar5);
            goto LAB_0012cb74;
          }
          local_60[0] = local_60[0] + 1;
          local_58[uVar6] = (ulong)pDVar5;
        }
        goto LAB_0012cb74;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar1 + (uVar1 == 0));
    uVar7 = uVar7 & 0xffffffff;
    pDVar5 = (D_Sym *)local_58[uVar7];
    while (pDVar5 != (D_Sym *)0x0) {
      local_58[uVar7] = (ulong)pDVar5->next;
      uVar6 = (ulong)pDVar5->hash % (local_50[3] & 0xffffffff);
      pDVar5->next = __s[uVar6];
      __s[uVar6] = pDVar5;
      pDVar5 = (D_Sym *)local_58[uVar7];
    }
    free(ppDVar4);
  }
  return;
}

Assistant:

static void symhash_add(D_SymHash *sh, D_Sym *s) {
  uint i, h = s->hash % sh->syms.n, n;
  D_Sym **v = sh->syms.v, *x;
  Vec(D_Sym *) vv, tv;

  sh->index++;
  s->next = v[h];
  v[h] = s;

  if (sh->index > sh->grow) {
    vv.v = sh->syms.v;
    vv.n = sh->syms.n;
    sh->syms.n = sh->grow;
    sh->grow = sh->grow * 2 + 1;
    sh->syms.v = MALLOC(sh->syms.n * sizeof(void *));
    memset(sh->syms.v, 0, sh->syms.n * sizeof(void *));
    v = sh->syms.v;
    n = sh->syms.n;
    vec_clear(&tv);
    for (i = 0; i < vv.n; i++) /* use temporary to preserve order */
      while (vv.v[i]) {
        x = vv.v[i];
        vv.v[i] = x->next;
        vec_add(&tv, x);
      }
    while (tv.v[i]) {
      x = tv.v[i];
      tv.v[i] = x->next;
      h = x->hash % n;
      x->next = v[h];
      v[h] = x;
    }
    FREE(vv.v);
  }
}